

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O0

void kill_dead(dill_stream c,basic_block_conflict bb,virtual_insn *insns,int loc)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int used_vregs [3];
  virtual_insn *ip;
  int stop;
  int k;
  int def_vreg;
  virtual_insn *root_insn;
  basic_block_conflict in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int local_34;
  int local_30;
  
  pcVar3 = (char *)(in_RDX + (long)in_ECX * 0x28);
  iVar1 = insn_defines((virtual_insn *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                      );
  local_34 = 0;
  if (*pcVar3 != '\x14') {
    if ((99 < iVar1) &&
       (*(short *)(*(long *)(*(long *)(in_RDI + 8) + 0x1d0) + (long)(iVar1 + -100) * 0x2c + 0x10) ==
        0)) {
      *pcVar3 = '\x18';
      set_unused((dill_stream)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8,0);
    }
    for (local_30 = in_ECX + 1; (long)local_30 <= *(long *)(in_RSI + 8) && local_34 == 0;
        local_30 = local_30 + 1) {
      insn_uses((virtual_insn *)(in_RDX + (long)local_30 * 0x28),(int *)&stack0xffffffffffffffb4);
      if (((iVar1 == in_stack_ffffffffffffffb4) || (iVar1 == in_stack_ffffffffffffffb8)) ||
         (iVar1 == in_stack_ffffffffffffffbc)) {
        local_34 = local_34 + 1;
      }
      else {
        iVar2 = insn_defines((virtual_insn *)
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        if (iVar2 == iVar1) {
          *pcVar3 = '\x18';
          local_34 = local_34 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

static void
kill_dead(dill_stream c, basic_block bb, virtual_insn* insns, int loc)
{
    virtual_insn* root_insn = &((virtual_insn*)insns)[loc];
    int def_vreg = insn_defines(root_insn);
    int k;
    int stop = 0;
    if (root_insn->class_code == iclass_call)
        return;
    if (def_vreg >= 100) {
        if (c->p->vregs[def_vreg - 100].use_info.use_count == 0) {
            root_insn->class_code = iclass_nop;
            set_unused(c, bb, def_vreg);
        }
    }
    for (k = loc + 1; ((k <= bb->end) && (!stop)); k++) {
        virtual_insn* ip = &((virtual_insn*)insns)[k];
        int used_vregs[3];
        insn_uses(ip, &used_vregs[0]);
        if ((def_vreg == used_vregs[0]) || (def_vreg == used_vregs[1]) ||
            (def_vreg == used_vregs[2])) {
            stop++;
        } else {
            if (insn_defines(ip) == def_vreg) {
                /* got another define before a use, kill the first */
                root_insn->class_code = iclass_nop;
                stop++;
            }
        }
    }
}